

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O2

void calc<double>(options2 *opt)

{
  string *__lhs;
  double Jx;
  double Jy;
  double dVar1;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> gVar2;
  root_type rVar3;
  fvar<double,_2UL> beta;
  fvar<double,_2UL> f_00;
  fvar<double,_2UL> f_01;
  fvar<double,_2UL> beta_00;
  fvar<double,_2UL> beta_01;
  long lVar4;
  bool bVar5;
  ostream *poVar6;
  invalid_argument *this;
  char *this_00;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  fvar<double,_2UL> f;
  fvar<double,_2UL> local_48;
  
  Jx = convert<double>(&opt->Jx);
  Jy = convert<double>(&opt->Jy);
  __lhs = &opt->Tmin;
  bVar5 = std::operator==(__lhs,"tc");
  if (!bVar5) {
    bVar5 = std::operator==(__lhs,"Tc");
    if (!bVar5) {
      dVar10 = convert<double>(__lhs);
      dVar9 = convert<double>(&opt->Tmax);
      dVar1 = convert<double>(&opt->dT);
      uVar7 = SUB84(dVar1,0);
      uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
      goto LAB_00118534;
    }
  }
  dVar10 = ising::tc::square<double>(Jx,Jy);
  uVar7 = SUB84(dVar10,0);
  uVar8 = (undefined4)((ulong)dVar10 >> 0x20);
  dVar9 = dVar10;
LAB_00118534:
  lVar4 = std::cout;
  if ((dVar9 < 0.0) || (dVar10 < 0.0)) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Temperature should be positive");
  }
  else if (dVar9 < dVar10) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
  }
  else {
    if (0.0 < (double)CONCAT44(uVar8,uVar7)) {
      *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb
           | 0x100;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar4 + -0x18)) = 0xf;
      poVar6 = std::operator<<((ostream *)&std::cout,"# lattice: square\n");
      poVar6 = std::operator<<(poVar6,"# precision: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf);
      poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
      this_00 = "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
      std::operator<<(poVar6,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n");
      for (; dVar10 < (double)CONCAT44(uVar8,uVar7) * 0.0001 + dVar9;
          dVar10 = dVar10 + (double)CONCAT44(uVar8,uVar7)) {
        dVar1 = 1.0 / dVar10;
        beta.v._M_elems[1] = 1.0;
        beta.v._M_elems[0] = dVar1;
        beta.v._M_elems[2] = 0.0;
        ising::free_energy::square::
        infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                  (&f,(square *)this_00,Jx,Jy,beta);
        std::operator<<((ostream *)&std::cout,"inf inf ");
        poVar6 = std::ostream::_M_insert<double>(Jx);
        std::operator<<(poVar6,' ');
        poVar6 = std::ostream::_M_insert<double>(Jy);
        std::operator<<(poVar6,' ');
        poVar6 = std::ostream::_M_insert<double>(dVar10);
        std::operator<<(poVar6,' ');
        poVar6 = std::ostream::_M_insert<double>(dVar1);
        std::operator<<(poVar6,' ');
        local_48.v._M_elems[2] = f.v._M_elems[2];
        local_48.v._M_elems[0] = f.v._M_elems[0];
        local_48.v._M_elems[1] = f.v._M_elems[1];
        gVar2 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::
                derivative<int>(&local_48,0);
        poVar6 = std::ostream::_M_insert<double>(gVar2);
        std::operator<<(poVar6,' ');
        f_00.v._M_elems[1] = f.v._M_elems[1];
        f_00.v._M_elems[0] = f.v._M_elems[0];
        f_00.v._M_elems[2] = f.v._M_elems[2];
        beta_00.v._M_elems[1] = 1.0;
        beta_00.v._M_elems[0] = dVar1;
        beta_00.v._M_elems[2] = 0.0;
        rVar3 = ising::free_energy::
                energy<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                          (f_00,beta_00);
        poVar6 = std::ostream::_M_insert<double>(rVar3);
        this_00 = (char *)0x20;
        std::operator<<(poVar6,' ');
        f_01.v._M_elems[1] = f.v._M_elems[1];
        f_01.v._M_elems[0] = f.v._M_elems[0];
        f_01.v._M_elems[2] = f.v._M_elems[2];
        beta_01.v._M_elems[1] = 1.0;
        beta_01.v._M_elems[0] = dVar1;
        beta_01.v._M_elems[2] = 0.0;
        rVar3 = ising::free_energy::
                specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                          (f_01,beta_01);
        poVar6 = std::ostream::_M_insert<double>(rVar3);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      return;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"dT should be positive");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << (1 / t)
              << ' ' << free_energy(f, beta) << ' ' << energy(f, beta) << ' '
              << specific_heat(f, beta) << std::endl;
  }
}